

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_align.h
# Opt level: O2

ArenaAlign google::protobuf::internal::ArenaAlignAs(size_t align)

{
  Nullable<const_char_*> failure_msg;
  LogMessage *this;
  LogMessage local_28;
  uint local_14;
  
  local_14 = 0;
  local_28._0_8_ = align;
  failure_msg = absl::lts_20250127::log_internal::Check_NEImpl<unsigned_long,unsigned_int>
                          ((unsigned_long *)&local_28,&local_14,"align != 0U");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align.h"
               ,0x9e,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_28);
  }
  if (align - 1 < (align ^ align - 1)) {
    return (ArenaAlign)align;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align.h"
             ,0x9f,"absl::has_single_bit(align)");
  this = absl::lts_20250127::log_internal::LogMessage::operator<<
                   (&local_28,(char (*) [19])"Invalid alignment ");
  absl::lts_20250127::log_internal::LogMessage::operator<<(this,align);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

inline ArenaAlign ArenaAlignAs(size_t align) {
  // align must be a non zero power of 2 >= 8
  ABSL_DCHECK_NE(align, 0U);
  ABSL_DCHECK(absl::has_single_bit(align)) << "Invalid alignment " << align;
  return ArenaAlign{align};
}